

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O1

void AI::evaluatePlan(Plan *plan,WorldState *currentState,WorldQuerier *worldQuerySystem,
                     TaskParameters *parameters,
                     vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                     *satisfiablePredicates)

{
  TaskIdentifier TVar1;
  TaskType TVar2;
  Task *pTVar3;
  pointer pcVar4;
  TaskIdentifier *pTVar5;
  pointer pTVar6;
  Task *pTVar7;
  bool bVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pTVar3 = (plan->currentTask)._M_current;
  if (pTVar3->type == Simple) {
    bVar8 = Condition::isTrue(&pTVar3->postconditions,currentState,pTVar3,satisfiablePredicates,
                              false);
    if (((!bVar8) &&
        ((bVar8 = Condition::isEmpty(&((plan->currentTask)._M_current)->breakConditions), bVar8 ||
         (pTVar3 = (plan->currentTask)._M_current,
         bVar8 = Condition::isTrue(&pTVar3->breakConditions,currentState,pTVar3,
                                   satisfiablePredicates,false), !bVar8)))) ||
       (((plan->currentTask)._M_current)->failed != false)) {
      pTVar3 = (plan->currentTask)._M_current;
      bVar8 = Condition::isTrue(&pTVar3->preconditions,currentState,pTVar3,satisfiablePredicates,
                                false);
      if (((bVar8) && (pTVar3 = (plan->currentTask)._M_current, pTVar3->isImmediate == false)) &&
         (pTVar3->failed != true)) {
        return;
      }
      WorldQuerier::getName_abi_cxx11_(&local_1d0,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
                ("[",&local_1d0,"] ",&local_330," preconditions false, plan failed");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      local_70.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_00123154;
    }
    else {
      WorldQuerier::getName_abi_cxx11_(&local_d0,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_d0,"] ","Finished task: ",&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = (plan->currentTask)._M_current;
      if ((pTVar3->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(pTVar3->finish)._M_invoker)((_Any_data *)&pTVar3->finish,currentState,pTVar3);
      }
      pTVar3 = (plan->currentTask)._M_current;
      lVar9 = (long)pTVar3->parentTaskIndex;
      if (lVar9 != -1) {
        pTVar6 = (plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar7 = pTVar6 + lVar9;
        TVar2 = pTVar6[lVar9].type;
        if (TVar2 == Compound) {
          if ((pTVar3->isLastInCompound == true) &&
             (bVar8 = Condition::isTrue(&pTVar7->postconditions,currentState,pTVar7,
                                        satisfiablePredicates,false), !bVar8)) {
            WorldQuerier::getName_abi_cxx11_(&local_110,worldQuerySystem);
            pcVar4 = (pTVar7->debugName)._M_dataplus._M_p;
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_290,pcVar4,pcVar4 + (pTVar7->debugName)._M_string_length);
            log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                      ("[",&local_110,"] ","Compound task: ",&local_290,
                       " finished but its postconditions were not met");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            local_70.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
            local_70._M_dataplus._M_p = local_110._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_00123154;
            goto LAB_0012314c;
          }
        }
        else if (TVar2 == Recursive) {
          if (pTVar3->isLastInCompound == true) {
            bVar8 = Condition::isTrue(&pTVar7->postconditions,currentState,pTVar7,
                                      satisfiablePredicates,false);
            if (!bVar8) {
              if (0 < pTVar7->remainingRepeats) {
                pTVar7->remainingRepeats = pTVar7->remainingRepeats + -1;
                WorldQuerier::getName_abi_cxx11_(&local_130,worldQuerySystem);
                local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                pcVar4 = (pTVar7->debugName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_350,pcVar4,pcVar4 + (pTVar7->debugName)._M_string_length
                          );
                log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                          ("[",&local_130,"] ","Recursive task: ",&local_350,
                           " finished, starting over since postconditions were not met");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                (plan->currentTask)._M_current =
                     (plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     ((plan->currentTask)._M_current)->parentTaskIndex;
                evaluatePlan(plan,currentState,worldQuerySystem,parameters,satisfiablePredicates);
                return;
              }
              WorldQuerier::getName_abi_cxx11_(&local_150,worldQuerySystem);
              pcVar4 = (pTVar7->debugName)._M_dataplus._M_p;
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,pcVar4,pcVar4 + (pTVar7->debugName)._M_string_length);
              log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                        ("[",&local_150,"] ","Recursive task: ",&local_2b0,
                         " failed, postconditions not met and remainingRepeats");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              local_70.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
              local_70._M_dataplus._M_p = local_150._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_00123154;
              goto LAB_0012314c;
            }
            WorldQuerier::getName_abi_cxx11_(&local_170,worldQuerySystem);
            pcVar4 = (pTVar7->debugName)._M_dataplus._M_p;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,pcVar4,pcVar4 + (pTVar7->debugName)._M_string_length);
            log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                      ("[",&local_170,"] ","Recursive task: ",&local_2d0," has finished");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else if ((TVar2 == Abstract) &&
                (bVar8 = Condition::isTrue(&pTVar7->postconditions,currentState,pTVar7,
                                           satisfiablePredicates,false), !bVar8)) {
          WorldQuerier::getName_abi_cxx11_(&local_f0,worldQuerySystem);
          pcVar4 = (pTVar7->debugName)._M_dataplus._M_p;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,pcVar4,pcVar4 + (pTVar7->debugName)._M_string_length);
          log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
                    ("[",&local_f0,"] ","Abstract task: ",&local_270,
                     " finished but its postconditions are not met");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          local_70.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
          local_70._M_dataplus._M_p = local_f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_00123154;
          goto LAB_0012314c;
        }
      }
      pTVar7 = (plan->currentTask)._M_current;
      pTVar3 = pTVar7 + 1;
      if ((plan->tasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
          super__Vector_impl_data._M_finish <= pTVar3) {
        WorldQuerier::getName_abi_cxx11_(&local_50,worldQuerySystem);
        log<char_const*,std::__cxx11::string,char_const*,char_const*>
                  ("[",&local_50,"] ","Plan finished successfully");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        plan->failed = false;
        plan->finished = true;
        return;
      }
      (plan->currentTask)._M_current = pTVar3;
      TVar1 = pTVar7[1].identifier;
      if ((TVar1 != Null) && (pTVar5 = (plan->currentPathVertex)._M_current, *pTVar5 != TVar1)) {
        (plan->currentPathVertex)._M_current = pTVar5 + 1;
      }
      WorldQuerier::getName_abi_cxx11_(&local_190,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_190,"] ","Started task: ",&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = (plan->currentTask)._M_current;
      if ((pTVar3->setup).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(pTVar3->setup)._M_invoker)
                  ((_Any_data *)&pTVar3->setup,pTVar3,currentState,worldQuerySystem);
      }
      pTVar3 = (plan->currentTask)._M_current;
      bVar8 = Condition::isTrue(&pTVar3->preconditions,currentState,pTVar3,satisfiablePredicates,
                                false);
      if (bVar8) {
        return;
      }
      WorldQuerier::getName_abi_cxx11_(&local_1b0,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_310,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,std::__cxx11::string,char_const*>
                ("[",&local_1b0,"] ",&local_310," preconditions false, plan failed");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_70.field_2._M_allocated_capacity = local_1b0.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_00123154;
    }
  }
  else {
    bVar8 = Condition::isTrue(&pTVar3->preconditions,currentState,pTVar3,satisfiablePredicates,false
                             );
    if (bVar8) {
      WorldQuerier::getName_abi_cxx11_(&local_90,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_90,"] ","skipping non-simple task: ",&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = (plan->currentTask)._M_current;
      if ((pTVar3->setup).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(pTVar3->setup)._M_invoker)
                  ((_Any_data *)&pTVar3->setup,pTVar3,currentState,worldQuerySystem);
      }
      pTVar3 = (plan->currentTask)._M_current;
      if ((pTVar3->loop).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(pTVar3->loop)._M_invoker)
                  ((_Any_data *)&pTVar3->loop,currentState,worldQuerySystem,pTVar3);
      }
      pTVar3 = (plan->currentTask)._M_current;
      (plan->currentTask)._M_current = pTVar3 + 1;
      TVar1 = pTVar3[1].identifier;
      if ((TVar1 != Null) && (pTVar5 = (plan->currentPathVertex)._M_current, *pTVar5 != TVar1)) {
        (plan->currentPathVertex)._M_current = pTVar5 + 1;
      }
      WorldQuerier::getName_abi_cxx11_(&local_b0,worldQuerySystem);
      pTVar3 = (plan->currentTask)._M_current;
      pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
      log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
                ("[",&local_b0,"] ","Started task: ",&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = (plan->currentTask)._M_current;
      if ((pTVar3->setup).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      (*(pTVar3->setup)._M_invoker)
                ((_Any_data *)&pTVar3->setup,pTVar3,currentState,worldQuerySystem);
      return;
    }
    WorldQuerier::getName_abi_cxx11_(&local_70,worldQuerySystem);
    pTVar3 = (plan->currentTask)._M_current;
    pcVar4 = (pTVar3->debugName)._M_dataplus._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar4,pcVar4 + (pTVar3->debugName)._M_string_length);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*>
              ("[",&local_70,"] ","Compound task: ",&local_1f0," preconditions were not met");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00123154;
  }
LAB_0012314c:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_00123154:
  plan->failed = true;
  return;
}

Assistant:

void evaluatePlan(Plan& plan, WorldState& currentState, WorldQuerier const& worldQuerySystem, TaskParameters& parameters, std::vector<SatisfiablePredicate>& satisfiablePredicates)
	{
		//is this an abstract or compound/.recursive task? they don't have any actions, so we can skip ahead		
		if (plan.currentTask->type != TaskType::Simple)			
		{
			if (!plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates))
			{
				log("[", worldQuerySystem.getName(), "] ", "Compound task: ", plan.currentTask->debugName, " preconditions were not met");
				plan.failed = true;
				return;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "skipping non-simple task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			if (plan.currentTask->loop)
			{
				plan.currentTask->loop(currentState, worldQuerySystem, *plan.currentTask);
			}

			plan.currentTask++;	

			if (plan.currentTask->identifier != TaskIdentifier::Null
				&& *plan.currentPathVertex != plan.currentTask->identifier)
			{
				plan.currentPathVertex++;
			}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->setup)
			{
				plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
			}

			return;
		}

		//are we done with the current task?
		if ((plan.currentTask->postconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)
			|| (!plan.currentTask->breakConditions.isEmpty() && plan.currentTask->breakConditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)))
			&& !plan.currentTask->failed)
		{	
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
			log("[", worldQuerySystem.getName(), "] ", "Finished task: ", plan.currentTask->debugName);
#endif

			if (plan.currentTask->finish)
			{
				plan.currentTask->finish(currentState, *plan.currentTask);
			}

			//is this the last task in an abstract implementation or a compound task?
			if (plan.currentTask->parentTaskIndex != -1)
			{		
				auto& parent = plan.tasks[plan.currentTask->parentTaskIndex];		

				if (parent.type == TaskType::Abstract) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates))
					{
						log("[", worldQuerySystem.getName(), "] ", "Abstract task: ", parent.debugName, " finished but its postconditions are not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Compound && plan.currentTask->isLastInCompound) 
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						log("[", worldQuerySystem.getName(), "] ", "Compound task: ", parent.debugName, " finished but its postconditions were not met");
						plan.failed = true;

						return;
					}
				}
				else if (parent.type == TaskType::Recursive && plan.currentTask->isLastInCompound)
				{
					if (!parent.postconditions.isTrue(currentState, parent, satisfiablePredicates)) 
					{
						if (parent.remainingRepeats > 0)
						{
							parent.remainingRepeats--;

							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " finished, starting over since postconditions were not met");
							plan.currentTask = begin(plan.tasks) + plan.currentTask->parentTaskIndex;
							evaluatePlan(plan, currentState, worldQuerySystem, parameters, satisfiablePredicates);
						}
						else
						{
							log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " failed, postconditions not met and remainingRepeats");
							plan.failed = true;
						}

						return;
					}
					else
					{
						log("[", worldQuerySystem.getName(), "] ", "Recursive task: ", parent.debugName, " has finished");
					}
				}				
			}

			//is there a next task?
			if ((plan.currentTask + 1) < end(plan.tasks))
			{
				//can we move to the next task?
				plan.currentTask++;

				if (plan.currentTask->identifier != TaskIdentifier::Null
					&& *plan.currentPathVertex != plan.currentTask->identifier)
				{
					plan.currentPathVertex++;
				}

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Started task: ", plan.currentTask->debugName);
#endif

				if (plan.currentTask->setup)
				{
					plan.currentTask->setup(*plan.currentTask, currentState, worldQuerySystem);
				}

				if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates)) 
				{
					return;
				}
				else
				{
					log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
					plan.failed = true;					
				}
			}
			else
			{

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", worldQuerySystem.getName(), "] ", "Plan finished successfully");
#endif

				plan.failed = false;
				plan.finished = true;			
			}			
		}
		else
		{
			//can we still do this task?
			if (plan.currentTask->preconditions.isTrue(currentState, *plan.currentTask, satisfiablePredicates) 
				&& !plan.currentTask->isImmediate && !plan.currentTask->failed)
			{
				return;
			}
			else
			{
				log("[", worldQuerySystem.getName(), "] ", plan.currentTask->debugName, " preconditions false, plan failed");
				plan.failed = true;
			}
		}
	}